

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::copy_over_missing_ports(Generator *this,shared_ptr<kratos::Generator> *ref)

{
  uint32_t width;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  PortDirection direction;
  PortType type;
  uint uVar3;
  element_type *peVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  reference port_name_00;
  element_type *peVar6;
  uint32_t *puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size;
  bool *pbVar8;
  Var *pVVar9;
  shared_ptr<kratos::Var> local_d0;
  string local_c0 [32];
  undefined1 local_a0 [8];
  shared_ptr<kratos::Param> param;
  Port *p;
  shared_ptr<kratos::Port> port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  shared_ptr<kratos::Generator> *ref_local;
  Generator *this_local;
  
  port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ref;
  peVar4 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ref);
  psVar5 = get_port_names_abi_cxx11_(peVar4);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1,psVar5);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&port_name), bVar2) {
    port_name_00 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end1);
    bVar2 = has_port(this,port_name_00);
    if (!bVar2) {
      peVar4 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      get_port((Generator *)&p,(string *)peVar4);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      direction = Port::port_direction(peVar6);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      puVar7 = Var::var_width(&peVar6->super_Var);
      width = *puVar7;
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      size = Var::size(&peVar6->super_Var);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      type = Port::port_type(peVar6);
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      pbVar8 = Var::is_signed(&peVar6->super_Var);
      param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           Generator::port(this,direction,port_name_00,width,size,type,(bool)(*pbVar8 & 1));
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      pVVar9 = Var::width_param(&peVar6->super_Var);
      if (pVVar9 != (Var *)0x0) {
        peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&p);
        pVVar9 = Var::width_param(&peVar6->super_Var);
        uVar3 = (*(pVVar9->super_IRNode)._vptr_IRNode[0x1b])();
        if ((uVar3 & 1) != 0) {
          peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&p);
          pVVar9 = Var::width_param(&peVar6->super_Var);
          (*(pVVar9->super_IRNode)._vptr_IRNode[0x1f])(local_c0);
          get_param((Generator *)local_a0,(string *)this);
          std::__cxx11::string::~string(local_c0);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
          _Var1 = param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          if (bVar2) {
            std::shared_ptr<kratos::Var>::shared_ptr<kratos::Param,void>
                      (&local_d0,(shared_ptr<kratos::Param> *)local_a0);
            Var::set_width_param((Var *)_Var1._M_pi,&local_d0);
            std::shared_ptr<kratos::Var>::~shared_ptr(&local_d0);
          }
          std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)local_a0);
        }
      }
      _Var1._M_pi = param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p);
      uVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x18])();
      (*(_Var1._M_pi)->_vptr__Sp_counted_base[0x19])(_Var1._M_pi,(ulong)(uVar3 & 1));
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&p);
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void Generator::copy_over_missing_ports(const std::shared_ptr<Generator> &ref) {
    auto port_names = ref->get_port_names();
    for (auto const &port_name : port_names) {
        if (has_port(port_name)) continue;
        auto port = ref->get_port(port_name);
        auto &p = this->port(port->port_direction(), port_name, port->var_width(), port->size(),
                             port->port_type(), port->is_signed());
        if (port->width_param() && port->width_param()->is_param()) {
            auto param = this->get_param(port->width_param()->to_string());
            if (param) {
                p.set_width_param(param);
            }
        }
        p.set_is_packed(port->is_packed());
    }
}